

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  type_conflict5 tVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rezi;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  int *lidx;
  int j;
  int i;
  int ll;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff898;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff8a0;
  undefined1 local_750 [8];
  int in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8c0;
  undefined1 local_6d0 [128];
  double in_stack_fffffffffffff9b0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff9b8;
  undefined8 local_550;
  undefined1 local_544 [128];
  int local_4c4;
  undefined1 local_4c0 [128];
  undefined8 local_440;
  undefined1 local_438 [128];
  undefined8 local_3b8;
  int local_3ac;
  undefined1 local_3a8 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  cpp_dec_float<200U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  long local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  long local_208;
  long local_200;
  int local_1f4;
  cpp_dec_float<200U,_int,_void> *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  cpp_dec_float<200U,_int,_void> *local_1d8;
  undefined1 *local_1d0;
  cpp_dec_float<200U,_int,_void> *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined4 *local_1b0;
  undefined1 *local_1a8;
  cpp_dec_float<200U,_int,_void> *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  cpp_dec_float<200U,_int,_void> *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_151;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  long local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  long local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  long local_a0;
  undefined8 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  int *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_1e8 = &local_2a8;
  local_20c = in_R8D;
  local_208 = in_RCX;
  local_200 = in_RDX;
  local_1f4 = in_ESI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8a0);
  local_1e0 = &local_328;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8a0);
  local_3ac = 1;
  local_80 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(local_200 + (long)local_1f4 * 0x80);
  local_70 = local_3a8;
  local_78 = &local_3ac;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,local_80);
  local_68 = local_3a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8a0);
  local_50 = local_3a8;
  local_60 = local_78;
  local_90 = (long)*local_78;
  local_58 = local_80;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff8a0,(longlong *)in_stack_fffffffffffff898,
             (cpp_dec_float<200U,_int,_void> *)0x6e0b01);
  local_170 = &local_328;
  local_178 = local_3a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_3b8 = 0;
  local_a0 = local_200 + (long)local_1f4 * 0x80;
  local_a8 = &local_3b8;
  local_98 = local_a8;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  local_210 = makeLvec(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8
                      );
  local_228 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6e0bce);
  local_220 = *(long *)(in_RDI + 0xb4);
  while( true ) {
    local_214 = local_20c + -1;
    local_218 = *(int *)(local_208 + (long)local_214 * 4);
    if (local_218 == local_1f4) break;
    *(int *)(local_220 + (long)local_210 * 4) = local_218;
    local_110 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(local_200 + (long)local_218 * 0x80);
    local_100 = local_438;
    local_108 = &local_328;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_111,local_108,local_110);
    local_f8 = local_438;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8a0);
    local_e0 = local_438;
    local_e8 = local_108;
    local_f0 = local_110;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
               (cpp_dec_float<200U,_int,_void> *)0x6e0d05);
    local_180 = local_228 + local_210;
    local_188 = local_438;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    local_440 = 0;
    local_b8 = local_200 + (long)local_218 * 0x80;
    local_c0 = &local_440;
    local_b0 = local_c0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    local_210 = local_210 + 1;
    local_20c = local_214;
  }
  *(int *)(local_220 + (long)local_210 * 4) = local_1f4;
  local_4c4 = 1;
  local_28 = local_4c0;
  local_30 = &local_4c4;
  local_38 = &local_328;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_38);
  local_20 = local_4c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8a0);
  local_8 = local_4c0;
  local_18 = local_30;
  local_48 = (long)*local_30;
  local_10 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff8a0,(longlong *)in_stack_fffffffffffff898,
             (cpp_dec_float<200U,_int,_void> *)0x6e0ebb);
  local_190 = local_228 + local_210;
  local_198 = local_4c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_210 = local_210 + 1;
  while (local_214 = local_214 + -1, -1 < local_214) {
    local_218 = *(int *)(local_208 + (long)local_214 * 4);
    *(int *)(local_220 + (long)local_210 * 4) = local_218;
    local_150 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(local_200 + (long)local_218 * 0x80);
    local_140 = local_544;
    local_148 = &local_328;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_151,local_148,local_150);
    local_138 = local_544;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8a0);
    local_120 = local_544;
    local_128 = local_148;
    local_130 = local_150;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
               (cpp_dec_float<200U,_int,_void> *)0x6e1029);
    in_stack_fffffffffffff8a0 = &local_2a8;
    local_1a8 = local_544;
    local_1a0 = in_stack_fffffffffffff8a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    local_160 = local_228 + local_210;
    local_168 = in_stack_fffffffffffff8a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    local_550 = 0;
    local_d0 = local_200 + (long)local_218 * 0x80;
    local_d8 = &local_550;
    local_c8 = local_d8;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    local_210 = local_210 + 1;
    local_1d0 = &stack0xfffffffffffff9b0;
    local_1d8 = &local_2a8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffff898);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff898,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6e117c);
    if (tVar1) {
      local_1c0 = local_750;
      local_1c8 = &local_2a8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffff898);
      local_1b0 = in_RDI + 0x23;
      local_1b8 = local_6d0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    }
  }
  *in_RDI = 0;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}